

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint filter(uchar *out,uchar *in,uint w,uint h,LodePNGColorMode *info,
           LodePNGEncoderSettings *settings)

{
  int *piVar1;
  uchar filterType;
  byte bVar2;
  uchar *out_00;
  undefined4 uVar3;
  size_t sVar4;
  uint uVar5;
  ulong bytewidth;
  ulong uVar6;
  ulong uVar7;
  LodePNGFilterStrategy LVar8;
  ulong uVar9;
  ulong uVar10;
  ulong length;
  uchar *puVar11;
  ucvector *puVar12;
  uchar *puVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  size_t *psVar19;
  ulong uVar20;
  bool bVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float result;
  float fVar26;
  uchar *local_548;
  uchar *local_540;
  uchar *local_530;
  ulong local_520;
  uchar *dummy;
  long local_4f8;
  ulong local_4f0;
  ucvector attempt_1 [5];
  size_t size [5];
  ucvector attempt [5];
  
  uVar9 = (ulong)h;
  uVar5 = lodepng_get_bpp(info);
  LVar8 = settings->filter_strategy;
  if ((settings->filter_palette_zero != 0) &&
     ((info->colortype == LCT_PALETTE || (info->bitdepth < 8)))) {
    LVar8 = LFS_ZERO;
  }
  if (uVar5 != 0) {
    if (LFS_PREDEFINED < LVar8) {
      return 0x58;
    }
    length = (ulong)(w * uVar5 + 7 >> 3);
    bytewidth = (ulong)(uVar5 + 7 >> 3);
    switch(LVar8) {
    case LFS_ZERO:
      uVar9 = (ulong)h;
      local_548 = out + 1;
      puVar13 = (uchar *)0x0;
      while (puVar11 = in, bVar21 = uVar9 != 0, uVar9 = uVar9 - 1, bVar21) {
        local_548[-1] = '\0';
        filterScanline(local_548,puVar11,puVar13,length,bytewidth,'\0');
        local_548 = local_548 + length + 1;
        in = puVar11 + length;
        puVar13 = puVar11;
      }
      return 0;
    case LFS_MINSUM:
      lVar18 = 0;
      do {
        if (lVar18 + 0x18 == 0x90) {
          puVar13 = out + 1;
          uVar20 = 0;
          uVar17 = 0;
          local_540 = (uchar *)0x0;
          for (uVar16 = 0; uVar16 != uVar9; uVar16 = uVar16 + 1) {
            lVar18 = uVar16 * length;
            for (uVar6 = 0; uVar6 != 5; uVar6 = uVar6 + 1) {
              puVar11 = attempt[uVar6].data;
              filterScanline(puVar11,in + lVar18,local_540,length,bytewidth,(uchar)uVar6);
              uVar7 = 0;
              uVar10 = 0;
              if (uVar6 == 0) {
                for (; length != uVar10; uVar10 = uVar10 + 1) {
                  uVar7 = uVar7 + puVar11[uVar10];
                }
              }
              else {
                for (; length != uVar10; uVar10 = uVar10 + 1) {
                  bVar2 = puVar11[uVar10];
                  uVar5 = bVar2 ^ 0xff;
                  if (-1 < (char)bVar2) {
                    uVar5 = (uint)bVar2;
                  }
                  uVar7 = uVar7 + uVar5;
                }
              }
              bVar21 = uVar7 < uVar20;
              if (bVar21 || uVar6 == 0) {
                uVar20 = uVar7;
              }
              if (bVar21 || uVar6 == 0) {
                uVar17 = uVar6 & 0xff;
              }
            }
            out[(length + 1) * uVar16] = (uchar)uVar17;
            for (uVar6 = 0; length != uVar6; uVar6 = uVar6 + 1) {
              puVar13[uVar6] = attempt[uVar17].data[uVar6];
            }
            puVar13 = puVar13 + length + 1;
            local_540 = in + lVar18;
          }
          for (lVar18 = 0; lVar18 != 0x78; lVar18 = lVar18 + 0x18) {
            ucvector_cleanup((void *)((long)&attempt[0].data + lVar18));
          }
          return 0;
        }
        puVar12 = (ucvector *)((long)&attempt[0].data + lVar18);
        puVar12->data = (uchar *)0x0;
        *(undefined8 *)((long)&attempt[0].size + lVar18) = 0;
        *(undefined8 *)((long)&attempt[0].allocsize + lVar18) = 0;
        uVar5 = ucvector_resize(puVar12,length);
        lVar18 = lVar18 + 0x18;
      } while (uVar5 != 0);
      break;
    case LFS_ENTROPY:
      lVar18 = 0;
      do {
        if (lVar18 + 0x18 == 0x90) {
          lVar18 = length + 1;
          puVar13 = out + 1;
          fVar22 = 0.0;
          uVar20 = 0;
          puVar11 = (uchar *)0x0;
          for (uVar17 = 0; uVar17 != uVar9; uVar17 = uVar17 + 1) {
            lVar14 = uVar17 * length;
            for (uVar16 = 0; uVar16 != 5; uVar16 = uVar16 + 1) {
              out_00 = attempt_1[uVar16].data;
              filterScanline(out_00,in + lVar14,puVar11,length,bytewidth,(uchar)uVar16);
              for (lVar15 = 0; lVar15 != 0x100; lVar15 = lVar15 + 1) {
                *(undefined4 *)((long)&attempt[0].data + lVar15 * 4) = 0;
              }
              for (uVar6 = 0; length != uVar6; uVar6 = uVar6 + 1) {
                piVar1 = (int *)((long)&attempt[0].data + (ulong)out_00[uVar6] * 4);
                *piVar1 = *piVar1 + 1;
              }
              piVar1 = (int *)((long)&attempt[0].data + uVar16 * 4);
              *piVar1 = *piVar1 + 1;
              fVar23 = 0.0;
              for (lVar15 = 0; lVar15 != 0x100; lVar15 = lVar15 + 1) {
                uVar5 = *(uint *)((long)&attempt[0].data + lVar15 * 4);
                if (uVar5 == 0) {
                  fVar24 = 0.0;
                }
                else {
                  fVar24 = (float)uVar5 / (float)(int)lVar18;
                  fVar26 = 0.0;
                  for (fVar25 = 1.0 / fVar24; 32.0 < fVar25; fVar25 = fVar25 * 0.0625) {
                    fVar26 = fVar26 + 4.0;
                  }
                  for (; 2.0 < fVar25; fVar25 = fVar25 * 0.5) {
                    fVar26 = fVar26 + 1.0;
                  }
                  fVar24 = fVar24 * ((fVar25 * fVar25 * 3.0 * -0.5 +
                                      (fVar25 * fVar25 * fVar25) / 3.0 + fVar25 * 3.0 + -1.83333) *
                                     1.442695 + fVar26);
                }
                fVar23 = fVar23 + fVar24;
              }
              if (fVar23 < fVar22 || uVar16 == 0) {
                uVar20 = uVar16 & 0xffffffff;
                fVar22 = fVar23;
              }
            }
            out[lVar18 * uVar17] = (uchar)uVar20;
            for (uVar16 = 0; length != uVar16; uVar16 = uVar16 + 1) {
              puVar13[uVar16] = attempt_1[uVar20].data[uVar16];
            }
            puVar13 = puVar13 + lVar18;
            puVar11 = in + lVar14;
          }
          for (lVar18 = 0; lVar18 != 0x78; lVar18 = lVar18 + 0x18) {
            ucvector_cleanup((void *)((long)&attempt_1[0].data + lVar18));
          }
          return 0;
        }
        puVar12 = (ucvector *)((long)&attempt_1[0].data + lVar18);
        puVar12->data = (uchar *)0x0;
        *(undefined8 *)((long)&attempt_1[0].size + lVar18) = 0;
        *(undefined8 *)((long)&attempt_1[0].allocsize + lVar18) = 0;
        uVar5 = ucvector_resize(puVar12,length);
        lVar18 = lVar18 + 0x18;
      } while (uVar5 != 0);
      break;
    case LFS_BRUTE_FORCE:
      uVar3 = (settings->zlibsettings).use_lz77;
      attempt_1[0].size._0_4_ = (settings->zlibsettings).windowsize;
      attempt_1[0].size._4_4_ = (settings->zlibsettings).minmatch;
      attempt_1[1].allocsize = (size_t)(settings->zlibsettings).custom_context;
      attempt_1[0].allocsize._0_4_ = (settings->zlibsettings).nicematch;
      attempt_1[0].allocsize._4_4_ = (settings->zlibsettings).lazymatching;
      attempt_1[0].data = (uchar *)CONCAT44(uVar3,1);
      attempt_1[1].data = (uchar *)0x0;
      attempt_1[1].size = 0;
      for (lVar18 = 0; lVar18 != 0x78; lVar18 = lVar18 + 0x18) {
        puVar12 = (ucvector *)((long)&attempt[0].data + lVar18);
        puVar12->data = (uchar *)0x0;
        *(undefined8 *)((long)&attempt[0].size + lVar18) = 0;
        *(undefined8 *)((long)&attempt[0].allocsize + lVar18) = 0;
        ucvector_resize(puVar12,length);
      }
      local_4f8 = length + 1;
      puVar13 = out + 1;
      local_530 = (uchar *)0x0;
      local_520 = 0;
      uVar5 = 0;
      local_4f0 = uVar9;
      for (uVar17 = 0; uVar17 != local_4f0; uVar17 = uVar17 + 1) {
        lVar14 = uVar17 * length;
        lVar15 = 0;
        psVar19 = &attempt[0].size;
        for (lVar18 = 0; lVar18 != 5; lVar18 = lVar18 + 1) {
          sVar4 = *psVar19;
          puVar11 = ((ucvector *)(psVar19 + -1))->data;
          filterScanline(puVar11,in + lVar14,local_530,length,bytewidth,(uchar)lVar18);
          size[lVar18] = 0;
          dummy = (uchar *)0x0;
          zlib_compress(&dummy,(size_t *)((long)size + lVar15),puVar11,(ulong)(uint)sVar4,
                        (LodePNGCompressSettings *)attempt_1);
          free(dummy);
          if (size[lVar18] < local_520 || lVar18 == 0) {
            uVar5 = (uint)lVar18;
            local_520 = size[lVar18];
          }
          psVar19 = psVar19 + 3;
          lVar15 = lVar15 + 8;
        }
        out[local_4f8 * uVar17] = (uchar)uVar5;
        for (uVar9 = 0; length != uVar9; uVar9 = uVar9 + 1) {
          puVar13[uVar9] = attempt[uVar5].data[uVar9];
        }
        puVar13 = puVar13 + local_4f8;
        local_530 = in + lVar14;
      }
      for (lVar18 = 0; lVar18 != 0x78; lVar18 = lVar18 + 0x18) {
        ucvector_cleanup((void *)((long)&attempt[0].data + lVar18));
      }
      return 0;
    case LFS_PREDEFINED:
      local_548 = out + 1;
      puVar13 = (uchar *)0x0;
      for (uVar17 = 0; puVar11 = in, uVar9 != uVar17; uVar17 = uVar17 + 1) {
        filterType = settings->predefined_filters[uVar17];
        local_548[-1] = filterType;
        filterScanline(local_548,puVar11,puVar13,length,bytewidth,filterType);
        local_548 = local_548 + length + 1;
        in = puVar11 + length;
        puVar13 = puVar11;
      }
      return 0;
    }
    return 0x53;
  }
  return 0x1f;
}

Assistant:

static unsigned filter(unsigned char* out, const unsigned char* in, unsigned w, unsigned h,
                       const LodePNGColorMode* info, const LodePNGEncoderSettings* settings)
{
  /*
  For PNG filter method 0
  out must be a buffer with as size: h + (w * h * bpp + 7) / 8, because there are
  the scanlines with 1 extra byte per scanline
  */

  unsigned bpp = lodepng_get_bpp(info);
  /*the width of a scanline in bytes, not including the filter type*/
  size_t linebytes = (w * bpp + 7) / 8;
  /*bytewidth is used for filtering, is 1 when bpp < 8, number of bytes per pixel otherwise*/
  size_t bytewidth = (bpp + 7) / 8;
  const unsigned char* prevline = 0;
  unsigned x, y;
  unsigned error = 0;
  LodePNGFilterStrategy strategy = settings->filter_strategy;

  /*
  There is a heuristic called the minimum sum of absolute differences heuristic, suggested by the PNG standard:
   *  If the image type is Palette, or the bit depth is smaller than 8, then do not filter the image (i.e.
      use fixed filtering, with the filter None).
   * (The other case) If the image type is Grayscale or RGB (with or without Alpha), and the bit depth is
     not smaller than 8, then use adaptive filtering heuristic as follows: independently for each row, apply
     all five filters and select the filter that produces the smallest sum of absolute values per row.
  This heuristic is used if filter strategy is LFS_MINSUM and filter_palette_zero is true.

  If filter_palette_zero is true and filter_strategy is not LFS_MINSUM, the above heuristic is followed,
  but for "the other case", whatever strategy filter_strategy is set to instead of the minimum sum
  heuristic is used.
  */
  if(settings->filter_palette_zero &&
     (info->colortype == LCT_PALETTE || info->bitdepth < 8)) strategy = LFS_ZERO;

  if(bpp == 0) return 31; /*error: invalid color type*/

  if(strategy == LFS_ZERO)
  {
    for(y = 0; y != h; ++y)
    {
      size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
      size_t inindex = linebytes * y;
      out[outindex] = 0; /*filter type byte*/
      filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, 0);
      prevline = &in[inindex];
    }
  }
  else if(strategy == LFS_MINSUM)
  {
    /*adaptive filtering*/
    size_t sum[5];
    ucvector attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t smallest = 0;
    unsigned char type, bestType = 0;

    for(type = 0; type != 5; ++type)
    {
      ucvector_init(&attempt[type]);
      if(!ucvector_resize(&attempt[type], linebytes)) return 83; /*alloc fail*/
    }

    if(!error)
    {
      for(y = 0; y != h; ++y)
      {
        /*try the 5 filter types*/
        for(type = 0; type != 5; ++type)
        {
          filterScanline(attempt[type].data, &in[y * linebytes], prevline, linebytes, bytewidth, type);

          /*calculate the sum of the result*/
          sum[type] = 0;
          if(type == 0)
          {
            for(x = 0; x != linebytes; ++x) sum[type] += (unsigned char)(attempt[type].data[x]);
          }
          else
          {
            for(x = 0; x != linebytes; ++x)
            {
              /*For differences, each byte should be treated as signed, values above 127 are negative
              (converted to signed char). Filtertype 0 isn't a difference though, so use unsigned there.
              This means filtertype 0 is almost never chosen, but that is justified.*/
              unsigned char s = attempt[type].data[x];
              sum[type] += s < 128 ? s : (255U - s);
            }
          }

          /*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
          if(type == 0 || sum[type] < smallest)
          {
            bestType = type;
            smallest = sum[type];
          }
        }

        prevline = &in[y * linebytes];

        /*now fill the out values*/
        out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
        for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType].data[x];
      }
    }

    for(type = 0; type != 5; ++type) ucvector_cleanup(&attempt[type]);
  }
  else if(strategy == LFS_ENTROPY)
  {
    float sum[5];
    ucvector attempt[5]; /*five filtering attempts, one for each filter type*/
    float smallest = 0;
    unsigned type, bestType = 0;
    unsigned count[256];

    for(type = 0; type != 5; ++type)
    {
      ucvector_init(&attempt[type]);
      if(!ucvector_resize(&attempt[type], linebytes)) return 83; /*alloc fail*/
    }

    for(y = 0; y != h; ++y)
    {
      /*try the 5 filter types*/
      for(type = 0; type != 5; ++type)
      {
        filterScanline(attempt[type].data, &in[y * linebytes], prevline, linebytes, bytewidth, type);
        for(x = 0; x != 256; ++x) count[x] = 0;
        for(x = 0; x != linebytes; ++x) ++count[attempt[type].data[x]];
        ++count[type]; /*the filter type itself is part of the scanline*/
        sum[type] = 0;
        for(x = 0; x != 256; ++x)
        {
          float p = count[x] / (float)(linebytes + 1);
          sum[type] += count[x] == 0 ? 0 : flog2(1 / p) * p;
        }
        /*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
        if(type == 0 || sum[type] < smallest)
        {
          bestType = type;
          smallest = sum[type];
        }
      }

      prevline = &in[y * linebytes];

      /*now fill the out values*/
      out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
      for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType].data[x];
    }

    for(type = 0; type != 5; ++type) ucvector_cleanup(&attempt[type]);
  }
  else if(strategy == LFS_PREDEFINED)
  {
    for(y = 0; y != h; ++y)
    {
      size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
      size_t inindex = linebytes * y;
      unsigned char type = settings->predefined_filters[y];
      out[outindex] = type; /*filter type byte*/
      filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, type);
      prevline = &in[inindex];
    }
  }
  else if(strategy == LFS_BRUTE_FORCE)
  {
    /*brute force filter chooser.
    deflate the scanline after every filter attempt to see which one deflates best.
    This is very slow and gives only slightly smaller, sometimes even larger, result*/
    size_t size[5];
    ucvector attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t smallest = 0;
    unsigned type = 0, bestType = 0;
    unsigned char* dummy;
    LodePNGCompressSettings zlibsettings = settings->zlibsettings;
    /*use fixed tree on the attempts so that the tree is not adapted to the filtertype on purpose,
    to simulate the true case where the tree is the same for the whole image. Sometimes it gives
    better result with dynamic tree anyway. Using the fixed tree sometimes gives worse, but in rare
    cases better compression. It does make this a bit less slow, so it's worth doing this.*/
    zlibsettings.btype = 1;
    /*a custom encoder likely doesn't read the btype setting and is optimized for complete PNG
    images only, so disable it*/
    zlibsettings.custom_zlib = 0;
    zlibsettings.custom_deflate = 0;
    for(type = 0; type != 5; ++type)
    {
      ucvector_init(&attempt[type]);
      ucvector_resize(&attempt[type], linebytes); /*todo: give error if resize failed*/
    }
    for(y = 0; y != h; ++y) /*try the 5 filter types*/
    {
      for(type = 0; type != 5; ++type)
      {
        unsigned testsize = attempt[type].size;
        /*if(testsize > 8) testsize /= 8;*/ /*it already works good enough by testing a part of the row*/

        filterScanline(attempt[type].data, &in[y * linebytes], prevline, linebytes, bytewidth, type);
        size[type] = 0;
        dummy = 0;
        zlib_compress(&dummy, &size[type], attempt[type].data, testsize, &zlibsettings);
        lodepng_free(dummy);
        /*check if this is smallest size (or if type == 0 it's the first case so always store the values)*/
        if(type == 0 || size[type] < smallest)
        {
          bestType = type;
          smallest = size[type];
        }
      }
      prevline = &in[y * linebytes];
      out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
      for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType].data[x];
    }
    for(type = 0; type != 5; ++type) ucvector_cleanup(&attempt[type]);
  }
  else return 88; /* unknown filter strategy */

  return error;
}